

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_schnorrsig.cpp
# Opt level: O2

void __thiscall SchnorrSig_Sign_Test::TestBody(SchnorrSig_Sign_Test *this)

{
  char *message;
  AssertionResult gtest_ar;
  string local_a0;
  string local_80;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  SchnorrSignature sig;
  
  cfd::core::SchnorrUtil::Sign(&sig,&::msg,&::sk,&aux_rand);
  cfd::core::SchnorrSignature::GetData((ByteData *)&local_48,&::signature,false);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_80,(ByteData *)&local_48);
  cfd::core::SchnorrSignature::GetData((ByteData *)&local_60,&sig,false);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_a0,(ByteData *)&local_60);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"signature.GetData().GetHex()","sig.GetData().GetHex()",&local_80
             ,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_80);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x26,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_80);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sig);
  return;
}

Assistant:

TEST(SchnorrSig, Sign) {
  auto sig = SchnorrUtil::Sign(msg, sk, aux_rand);

  EXPECT_EQ(signature.GetData().GetHex(), sig.GetData().GetHex());
}